

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O3

int __thiscall Acceptor::listen(Acceptor *this,int __fd,int __n)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  undefined7 extraout_var;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  pLVar3 = Logger::get_instance();
  if ((pLVar3->l_inited == false) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","listen",0x37);
  }
  if (1 < (int)g_log_level) {
    pLVar3 = Logger::get_instance();
    Logger::write_log(pLVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp"
                      ,"listen",0x37,LOG_LEVEL_INFO,"acceptor execute listen, listen fd is %d\n",
                      this->ac_listen_fd);
    pLVar3 = Logger::get_instance();
    Logger::flush(pLVar3);
  }
  iVar2 = ::listen(this->ac_listen_fd,1000);
  if (iVar2 != -1) {
    this->ac_listening = true;
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp:61:51)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp:61:51)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    Epoll::epoll_add((this->ac_loop->el_epoller).
                     super___shared_ptr<Epoll,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->ac_listen_fd
                     ,1,(EventCallback *)&local_30);
    if (local_20 != (code *)0x0) {
      bVar1 = (*local_20)(&local_30,&local_30,__destroy_functor);
      local_20 = (code *)CONCAT71(extraout_var,bVar1);
    }
    return (int)local_20;
  }
  if (-1 < pr_level) {
    printf("[%-5s][%s:%d] server listen error\n","error","listen",0x39);
  }
  exit(1);
}

Assistant:

void Acceptor::listen()
{
LOG_INFO("acceptor execute listen, listen fd is %d\n", ac_listen_fd);
    if (::listen(ac_listen_fd, 1000) == -1) {
        PR_ERROR("server listen error\n");
        exit(1);
    }
    ac_listening = true;
    ac_loop->add_to_poller(ac_listen_fd, EPOLLIN, [this](){ this->do_accept(); });
}